

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

Var __thiscall Js::SourceTextModuleRecord::ModuleEvaluation(SourceTextModuleRecord *this)

{
  Type *pTVar1;
  uint uVar2;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  WriteBarrierPtr<Js::SourceTextModuleRecord> *pWVar4;
  code *pcVar5;
  bool bVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  Type *ppIVar9;
  ulong uVar10;
  ulong uVar11;
  RecyclableObject *pRVar12;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar13;
  char16_t *local_50;
  Iterator local_48;
  SourceTextModuleRecord *local_38;
  SourceTextModuleRecord *childModuleRecord;
  
  pcVar7 = GetSpecifierSz(this);
  pRVar12 = (RecyclableObject *)0x0;
  Output::TraceWithFlush(ModulePhase,L"ModuleEvaluation(%s)\n",pcVar7);
  if ((this->super_ModuleRecordBase).wasEvaluated == false) {
    if ((this->evaluating == false) &&
       (((((this->scriptContext).ptr)->config).threadConfig)->m_ES6Module == true)) {
      if ((this->wasPrepassed != false) || (bVar6 = ModuleEvaluationPrepass(this), bVar6)) {
        if ((this->errorObject).ptr != (void *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x431,"(this->errorObject == nullptr)",
                                      "this->errorObject == nullptr");
          if (!bVar6) {
LAB_009ea52e:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar8 = 0;
        }
        this->evaluating = true;
        pSVar13 = (this->requestedModuleList).ptr;
        if (pSVar13 != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Reverse
                    (&pSVar13->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>);
          pSVar13 = (this->requestedModuleList).ptr;
          local_48.list = &pSVar13->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>;
          local_48.current = (NodeBase *)pSVar13;
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          do {
            if (pSVar13 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                          ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar6) goto LAB_009ea52e;
              *puVar8 = 0;
              pSVar13 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
            }
            pSVar13 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                      (pSVar13->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                      super_SListNodeBase<Memory::ArenaAllocator>.next;
            if (pSVar13 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list)
            break;
            local_48.current = (NodeBase *)pSVar13;
            ppIVar9 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                (&local_48);
            local_38 = (SourceTextModuleRecord *)0x0;
            local_50 = (char16_t *)&(*ppIVar9)->field_0x22;
            bVar6 = JsUtil::
                    BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::TryGetValue<char16_t_const*>
                              ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)(this->childrenModuleSet).ptr,&local_50,&local_38);
            if (!bVar6) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x439,
                                          "(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord))"
                                          ,
                                          "childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord)"
                                         );
              if (!bVar6) goto LAB_009ea52e;
              *puVar8 = 0;
            }
            (*(local_38->super_ModuleRecordBase).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])();
            pSVar13 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
            if ((local_38->errorObject).ptr != (void *)0x0) {
              ReleaseParserResourcesForHierarchy(this);
              JavascriptExceptionOperators::Throw
                        ((local_38->errorObject).ptr,(this->scriptContext).ptr);
            }
          } while( true );
        }
        if (this->awaitedModules == 0) {
          FinishModuleEvaluation(this,true);
        }
        else {
          pLVar3 = (this->parentModuleList).ptr;
          if (pLVar3 != (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *)0x0) {
            uVar2 = (pLVar3->
                    super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                    ).count;
            pWVar4 = (pLVar3->
                     super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ).buffer.ptr;
            uVar11 = 0;
            uVar10 = (ulong)uVar2;
            if ((int)uVar2 < 1) {
              uVar10 = uVar11;
            }
            for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
              pTVar1 = &(pWVar4[uVar11].ptr)->awaitedModules;
              *pTVar1 = *pTVar1 + 1;
            }
          }
        }
      }
      pRVar12 = (((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      pRVar12 = (RecyclableObject *)0x0;
    }
  }
  return pRVar12;
}

Assistant:

Var SourceTextModuleRecord::ModuleEvaluation()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ModuleEvaluation(%s)\n"), this->GetSpecifierSz());

        if (WasEvaluated() || IsEvaluating() || !scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            return nullptr;
        }

        try
        {
            if (!WasEvaluationPrepassed())
            {
                if (!ModuleEvaluationPrepass())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }

            Assert(this->errorObject == nullptr);
            SetEvaluating(true);
            
            if (requestedModuleList != nullptr)
            {
                requestedModuleList->Reverse();
                requestedModuleList->Map([&](IdentPtr specifier) {
                    SourceTextModuleRecord* childModuleRecord = nullptr;
                    AssertOrFailFast(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord));

                    childModuleRecord->ModuleEvaluation();
                    // if child module was evaluated before and threw need to re-throw now
                    // if child module has been dynamically imported and has exception need to throw
                    if (childModuleRecord->GetErrorObject() != nullptr)
                    {
                        this->ReleaseParserResourcesForHierarchy();

                        JavascriptExceptionOperators::Throw(childModuleRecord->GetErrorObject(), this->scriptContext);
                    }
                });
            }
            if (awaitedModules == 0)
            {
                FinishModuleEvaluation(true);
            }
            else
            {
                if (this->parentModuleList != nullptr)
                {
                    parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
                    {
                        parentModule->IncrementAwaited();
                    });
                }
            }
        }
        catch (const Js::JavascriptException &err)
        {
            if (!WasEvaluated())
            {
                SetWasEvaluated();
            }
            SetEvaluating(false);
            JavascriptExceptionObject *exception = err.GetAndClear();
            Var errorObject = exception->GetThrownObject(scriptContext);
            AssertOrFailFastMsg(errorObject != nullptr, "ModuleEvaluation: null error object thrown from root function");
            this->errorObject = errorObject;
            if (this->promise != nullptr)
            {
                ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext, this, false);
            }
            if (isRootModule && !ReportModuleCompletion(this, errorObject))
            {
                JavascriptExceptionOperators::DoThrowCheckClone(exception, scriptContext);
            }
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }